

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_lessthan(lua_State *L,int idx1,int idx2)

{
  TValue *pTVar1;
  TValue *o2;
  TValue *pTVar2;
  TValue *base;
  
  pTVar1 = index2adr(L,idx1);
  o2 = index2adr(L,idx2);
  pTVar2 = (TValue *)((ulong)(L->glref).ptr32 + 0x130);
  base = (TValue *)0x0;
  if (o2 != pTVar2 && pTVar1 != pTVar2) {
    if (((pTVar1->field_2).it < 0xffff0000) && ((o2->field_2).it < 0xffff0000)) {
      base = (TValue *)(ulong)(pTVar1->n <= o2->n && o2->n != pTVar1->n);
    }
    else {
      base = lj_meta_comp(L,pTVar1,o2,0);
      if ((TValue *)0x1 < base) {
        L->top = base + 2;
        jit_secure_call(L,base,2);
        pTVar1 = L->top;
        L->top = pTVar1 + -2;
        base = (TValue *)(ulong)(*(uint *)((long)pTVar1 + -4) < 0xfffffffe);
      }
    }
  }
  return (int)base;
}

Assistant:

LUA_API int lua_lessthan(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (o1 == niltv(L) || o2 == niltv(L)) {
    return 0;
  } else if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) < intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) < numberVnum(o2);
  } else {
    TValue *base = lj_meta_comp(L, o1, o2, 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      jit_secure_call(L, base, 1+1);
      L->top -= 2+LJ_FR2;
      return tvistruecond(L->top+1+LJ_FR2);
    }
  }
}